

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O0

void __thiscall Wasm::WasmBytecodeGenerator::EnregisterLocals(WasmBytecodeGenerator *this)

{
  code *pcVar1;
  uint uVar2;
  bool bVar3;
  ArgSlot AVar4;
  RegSlot loc;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  WasmLocal *pWVar5;
  FunctionBody *this_01;
  undefined4 *puVar6;
  WasmLocal local_68;
  WasmRegisterSpace *local_60;
  WasmRegisterSpace *regSpace;
  WasmType type;
  uint32 i;
  undefined8 local_48;
  TrackAllocData local_40;
  uint32 local_14;
  WasmBytecodeGenerator *pWStack_10;
  uint32 nLocals;
  WasmBytecodeGenerator *this_local;
  
  pWStack_10 = this;
  local_14 = WasmFunctionInfo::GetLocalCount(this->m_funcInfo);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_40,(type_info *)&WasmLocal::typeinfo,0,(ulong)local_14,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
             ,0x265);
  this_00 = Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            TrackAllocInfo(&(this->m_alloc).
                            super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>
                           ,&local_40);
  _type = Memory::ArenaAllocator::Alloc;
  local_48 = 0;
  pWVar5 = Memory::AllocateArray<Memory::ArenaAllocator,Wasm::WasmLocal,false>
                     ((Memory *)this_00,(ArenaAllocator *)Memory::ArenaAllocator::Alloc,0,
                      (ulong)local_14);
  this->m_locals = pWVar5;
  this_01 = WasmFunctionInfo::GetBody(this->m_funcInfo);
  Js::FunctionBody::SetFirstTmpReg(this_01,local_14);
  regSpace._4_4_ = 0;
  do {
    if (local_14 <= regSpace._4_4_) {
      return;
    }
    regSpace._0_4_ = WasmFunctionInfo::GetLocal(this->m_funcInfo,regSpace._4_4_);
    local_60 = GetRegisterSpace(this,(Local)regSpace);
    loc = WAsmJs::RegisterSpace::AcquireRegister(local_60);
    WasmLocal::WasmLocal(&local_68,loc,(Local)regSpace);
    uVar2 = regSpace._4_4_;
    this->m_locals[regSpace._4_4_] = local_68;
    AVar4 = WasmFunctionInfo::GetParamCount(this->m_funcInfo);
    if (AVar4 <= uVar2) {
      switch((Local)regSpace) {
      case FirstLocalType:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[10])
                  (this->m_writer,9,(ulong)this->m_locals[regSpace._4_4_].location,0);
        break;
      case I64:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0xb])
                  (this->m_writer,0xb,(ulong)this->m_locals[regSpace._4_4_].location,0);
        break;
      case F32:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0xc])
                  (0,this->m_writer,0xd,(ulong)this->m_locals[regSpace._4_4_].location);
        break;
      case F64:
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0xd])
                  (0,this->m_writer,0xf,(ulong)this->m_locals[regSpace._4_4_].location);
        break;
      case V128:
        Simd::EnsureSimdIsEnabled();
        (*this->m_writer->_vptr_IWasmByteCodeWriter[0x17])
                  (this->m_writer,0x18b,(ulong)this->m_locals[regSpace._4_4_].location,0,0,0,0);
        break;
      default:
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/WasmReader/WasmByteCodeGenerator.cpp"
                           ,0x287,"((0))","(0)");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
    regSpace._4_4_ = regSpace._4_4_ + 1;
  } while( true );
}

Assistant:

void WasmBytecodeGenerator::EnregisterLocals()
{
    uint32 nLocals = m_funcInfo->GetLocalCount();
    m_locals = AnewArray(&m_alloc, WasmLocal, nLocals);

    m_funcInfo->GetBody()->SetFirstTmpReg(nLocals);
    for (uint32 i = 0; i < nLocals; ++i)
    {
        WasmTypes::WasmType type = m_funcInfo->GetLocal(i);
        WasmRegisterSpace* regSpace = GetRegisterSpace(type);
        m_locals[i] = WasmLocal(regSpace->AcquireRegister(), type);

        // Zero only the locals not corresponding to formal parameters.
        if (i >= m_funcInfo->GetParamCount()) {
            switch (type)
            {
            case WasmTypes::F32:
                m_writer->AsmFloat1Const1(Js::OpCodeAsmJs::Ld_FltConst, m_locals[i].location, 0.0f);
                break;
            case WasmTypes::F64:
                m_writer->AsmDouble1Const1(Js::OpCodeAsmJs::Ld_DbConst, m_locals[i].location, 0.0);
                break;
            case WasmTypes::I32:
                m_writer->AsmInt1Const1(Js::OpCodeAsmJs::Ld_IntConst, m_locals[i].location, 0);
                break;
            case WasmTypes::I64:
                m_writer->AsmLong1Const1(Js::OpCodeAsmJs::Ld_LongConst, m_locals[i].location, 0);
                break;
#ifdef ENABLE_WASM_SIMD
            case WasmTypes::V128:
            {
                Simd::EnsureSimdIsEnabled();
                m_writer->WasmSimdConst(Js::OpCodeAsmJs::Simd128_LdC, m_locals[i].location, 0, 0, 0, 0);
                break;
            }
#endif
            default:
                Assume(UNREACHED);
            }
        }
    }
}